

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O1

void __thiscall Png::Png(Png *this,path *filePath)

{
  File *this_00;
  DefaultInitVec<Rgba> *this_01;
  png_colorp *pppVar1;
  int *piVar2;
  png_bytep *pppVar3;
  png_bytep ppVar4;
  png_colorp ppVar5;
  void *pvVar6;
  uint uVar7;
  char cVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  undefined4 extraout_var;
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>,_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  pbVar13;
  png_structp ppVar14;
  png_infop ppVar15;
  ulong uVar16;
  size_type __n;
  int *piVar17;
  char *pcVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  char *pcVar22;
  ulong uVar23;
  Rgba *pRVar24;
  ulong uVar25;
  png_uint_32 y;
  png_uint_32 pVar26;
  Rgba local_104;
  png_structp *local_100;
  uint32_t *local_f8;
  uint32_t *local_f0;
  Png *local_e8;
  DefaultInitVec<Rgba> *local_e0;
  File *local_d8;
  int interlaceType;
  int bitDepth;
  DefaultInitVec<png_byte> row;
  vector<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
  conflicts;
  array<unsigned_char,_8UL> pngHeader;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indeterminates;
  anon_class_24_3_904f71aa assignColor;
  
  this->path = filePath;
  this_00 = &this->file;
  *(undefined8 *)
   &(this->file)._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_> = 0;
  *(__index_type *)
   ((long)&(this->file)._file.
           super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
           .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
           super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
           super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
           super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_> + 0xf0) =
       '\0';
  local_100 = &this->png;
  this_01 = &this->pixels;
  this->png = (png_structp)0x0;
  this->info = (png_infop)0x0;
  memset(this_01,0,0x2801d);
  lVar12 = 0x134;
  do {
    *(undefined1 *)((long)&this->path + lVar12) = 0;
    lVar12 = lVar12 + 5;
  } while (lVar12 != 0x28139);
  this->embeddedPal = (png_colorp)0x0;
  this->transparencyPal = (png_bytep)0x0;
  iVar10 = File::open(this_00,(char *)filePath,0xc);
  local_e8 = this;
  if (CONCAT44(extraout_var,iVar10) == 0) {
    conflicts.
    super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this->path;
    std::
    visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
              ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                *)&row,(Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
                        *)&conflicts,&this_00->_file);
    piVar17 = __errno_location();
    pcVar22 = strerror(*piVar17);
    fatal("Failed to open input image (\"%s\"): %s",
          CONCAT44(row.
                   super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                   (int)row.
                        super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start),pcVar22);
  }
  Options::verbosePrint(&options,'\x02',"Opened input file\n");
  pbVar13 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                            *)&row,&this_00->_file);
  lVar12 = (**(code **)(*(long *)pbVar13 + 0x40))(pbVar13,&pngHeader,8);
  if ((lVar12 != 8) || (iVar10 = png_sig_cmp(&pngHeader,0,8), iVar10 != 0)) {
    conflicts.
    super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this->path;
    std::
    visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
              ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                *)&row,(Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
                        *)&conflicts,&this_00->_file);
    fatal("Input file (\"%s\") is not a PNG image!",
          CONCAT44(row.
                   super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                   (int)row.
                        super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start));
  }
  Options::verbosePrint(&options,'\x03',"PNG header signature is OK\n");
  ppVar14 = (png_structp)png_create_read_struct("1.6.37",this,handleError,handleWarning);
  *local_100 = ppVar14;
  if (ppVar14 == (png_structp)0x0) {
    pcVar22 = "Failed to allocate PNG structure: %s";
  }
  else {
    ppVar15 = (png_infop)png_create_info_struct(ppVar14);
    this->info = ppVar15;
    if (ppVar15 != (png_infop)0x0) {
      png_set_read_fn(this->png,this,readData);
      png_set_sig_bytes(*local_100,8);
      png_read_info(this->png,this->info);
      local_f8 = &this->width;
      local_f0 = &this->height;
      piVar17 = &this->colorType;
      png_get_IHDR(this->png,this->info,local_f8,local_f0,&bitDepth,piVar17,&interlaceType,0,0);
      if ((options.inputSlice.width == 0) && ((*local_f8 & 7) != 0)) {
        pcVar22 = "Image width (%u pixels) is not a multiple of 8!";
      }
      else {
        if ((options.inputSlice.height != 0) || ((*local_f0 & 7) == 0)) {
          std::vector<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>::resize
                    (this_01,(ulong)*local_f0 * (ulong)*local_f8);
          uVar11 = *piVar17;
          pcVar22 = "Unknown color type %d";
          local_e0 = this_01;
          local_d8 = this_00;
          if (((ulong)uVar11 < 7) && ((0x5dU >> (uVar11 & 0x1f) & 1) != 0)) {
            if (interlaceType == 0) {
              pcVar22 = "not interlaced";
            }
            else {
              if (interlaceType != 1) {
                pcVar22 = "Unknown interlace type %d";
                goto LAB_0011075c;
              }
              pcVar22 = "interlaced (Adam7)";
            }
            Options::verbosePrint
                      (&options,'\x03',"Input image: %ux%u pixels, %dbpp %s, %s\n",(ulong)*local_f8,
                       (ulong)*local_f0,(ulong)(uint)bitDepth,
                       &DAT_00117eac + *(int *)(&DAT_00117eac + (ulong)uVar11 * 4),pcVar22);
            pppVar1 = &this->embeddedPal;
            piVar2 = &this->nbColors;
            iVar10 = png_get_PLTE(this->png,this->info,pppVar1,piVar2);
            if (iVar10 == 0) {
              Options::verbosePrint(&options,'\x03',"No embedded palette\n");
            }
            else {
              pppVar3 = &this->transparencyPal;
              iVar10 = png_get_tRNS(this->png,this->info,pppVar3,&row,0);
              if ((iVar10 != 0) &&
                 ((int)row.
                       super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start != *piVar2)) {
                __assert_fail("nbTransparentEntries == nbColors",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                              ,0x107,"Png");
              }
              Options::verbosePrint
                        (&options,'\x03',"Embedded palette has %d colors: [",(ulong)(uint)*piVar2);
              uVar16 = (ulong)(uint)*piVar2;
              this = local_e8;
              if (0 < *piVar2) {
                lVar12 = 2;
                uVar25 = 0;
                do {
                  ppVar4 = *pppVar3;
                  if (ppVar4 == (png_bytep)0x0) {
                    uVar23 = 0xff;
                  }
                  else {
                    uVar23 = (ulong)ppVar4[uVar25];
                  }
                  ppVar5 = *pppVar1;
                  pcVar22 = ", ";
                  if (uVar25 == (int)uVar16 - 1) {
                    pcVar22 = "]\n";
                  }
                  Options::verbosePrint
                            (&options,'\x03',"#%02x%02x%02x%02x%s",
                             (ulong)*(byte *)((long)ppVar5 + lVar12 + -2),
                             (ulong)*(byte *)((long)ppVar5 + lVar12 + -1),
                             (ulong)(&ppVar5->red)[lVar12],uVar23,pcVar22);
                  uVar25 = uVar25 + 1;
                  uVar16 = (ulong)*piVar2;
                  lVar12 = lVar12 + 3;
                  this = local_e8;
                } while ((long)uVar25 < (long)uVar16);
              }
            }
            if ((*piVar17 & 0xfffffffbU) == 3) {
              png_set_palette_to_rgb(*local_100);
            }
            else if ((*piVar17 & 0xfffffffbU) == 0) {
              png_set_gray_to_rgb(*local_100);
            }
            iVar10 = png_get_valid(this->png,this->info,0x10);
            if (iVar10 == 0) {
              if ((*piVar17 & 4) == 0) {
                png_set_add_alpha(*local_100,0xffff,1);
              }
            }
            else {
              png_set_tRNS_to_alpha(*local_100);
            }
            if (bitDepth == 0x10) {
              png_set_scale_16(*local_100);
            }
            else if (bitDepth < 8) {
              png_set_packing(*local_100);
            }
            png_read_update_info(this->png,this->info);
            uVar11 = png_get_image_width(this->png,this->info);
            if (uVar11 != *local_f8) {
              __assert_fail("png_get_image_width(png, info) == width",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                            ,0x138,"Png");
            }
            uVar11 = png_get_image_height(this->png,this->info);
            if (uVar11 != *local_f0) {
              __assert_fail("png_get_image_height(png, info) == height",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                            ,0x139,"Png");
            }
            cVar8 = png_get_color_type(this->png,this->info);
            if (cVar8 != '\x06') {
              __assert_fail("png_get_color_type(png, info) == PNG_COLOR_TYPE_RGBA",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                            ,0x13b,"Png");
            }
            cVar8 = png_get_bit_depth(this->png,this->info);
            if (cVar8 != '\b') {
              __assert_fail("png_get_bit_depth(png, info) == 8",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                            ,0x13c,"Png");
            }
            __n = png_get_rowbytes(this->png,this->info);
            if (__n == 0) {
              __assert_fail("nbRowBytes != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                            ,0x141,"Png");
            }
            std::
            vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::vector(&row,__n,(allocator_type *)&conflicts);
            conflicts.
            super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            conflicts.
            super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            conflicts.
            super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            assignColor.indeterminates = &indeterminates;
            indeterminates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            indeterminates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            indeterminates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            assignColor.this = this;
            assignColor.conflicts = &conflicts;
            if (interlaceType == 0) {
              if (*local_f0 != 0) {
                pVar26 = 0;
                do {
                  png_read_row(*local_100,
                               CONCAT44(row.
                                        super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        (int)row.
                                             super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start),0);
                  if (*local_f8 != 0) {
                    uVar11 = 3;
                    uVar16 = 0;
                    do {
                      lVar12 = CONCAT44(row.
                                        super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        (int)row.
                                             super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                      local_104.green = *(uint8_t *)(lVar12 + (ulong)(uVar11 - 2));
                      local_104.red = *(uint8_t *)(lVar12 + (ulong)(uVar11 - 3));
                      local_104.blue = *(uint8_t *)(lVar12 + (ulong)(uVar11 - 1));
                      local_104.alpha = *(uint8_t *)(lVar12 + (ulong)uVar11);
                      Png::anon_class_24_3_904f71aa::operator()
                                (&assignColor,(png_uint_32)uVar16,pVar26,&local_104);
                      uVar16 = uVar16 + 1;
                      uVar11 = uVar11 + 4;
                    } while (uVar16 < *local_f8);
                  }
                  pVar26 = pVar26 + 1;
                } while (pVar26 < *local_f0);
              }
            }
            else {
              if (interlaceType != 1) {
                __assert_fail("interlaceType == PNG_INTERLACE_ADAM7",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                              ,0x171,"Png");
              }
              uVar11 = 0;
              do {
                bVar9 = (byte)(7 - uVar11 >> 1);
                if (uVar11 < 2) {
                  bVar9 = 3;
                }
                iVar10 = 1 << (bVar9 & 0x1f);
                uVar19 = uVar11 + 1;
                uVar20 = (uVar11 & 1) << (3U - (char)(uVar19 >> 1) & 0x1f);
                uVar7 = uVar20 & 7;
                if (~(uVar20 & 7) + iVar10 + *local_f8 >> (bVar9 & 0x1f) != 0) {
                  bVar9 = (byte)(8 - uVar11 >> 1);
                  if (uVar11 < 3) {
                    bVar9 = 3;
                  }
                  iVar21 = 1 << (bVar9 & 0x1f);
                  pVar26 = (uVar11 & 1 ^ 1) << (3U - (char)(uVar11 >> 1) & 0x1f) & 7;
                  if ((~pVar26 + *local_f0 + iVar21 >> (bVar9 & 0x1f) != 0) && (pVar26 < *local_f0))
                  {
                    do {
                      pRVar24 = (Rgba *)CONCAT44(row.
                                                 super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 (int)row.
                                                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                      png_read_row(*local_100,pRVar24,0);
                      uVar11 = uVar7;
                      if (uVar7 < *local_f8) {
                        do {
                          local_104 = *pRVar24;
                          Png::anon_class_24_3_904f71aa::operator()
                                    (&assignColor,uVar11,pVar26,&local_104);
                          pRVar24 = pRVar24 + 1;
                          uVar11 = uVar11 + iVar10;
                        } while (uVar11 < *local_f8);
                      }
                      pVar26 = pVar26 + iVar21;
                    } while (pVar26 < *local_f0);
                  }
                }
                uVar11 = uVar19;
              } while (uVar19 != 7);
            }
            png_read_end(*local_100,0);
            if (indeterminates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(indeterminates.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)indeterminates.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)indeterminates.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (conflicts.
                super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(conflicts.
                              super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)conflicts.
                                    super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)conflicts.
                                    super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            pvVar6 = (void *)CONCAT44(row.
                                      super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)row.
                                           super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
            if (pvVar6 != (void *)0x0) {
              operator_delete(pvVar6,(long)row.
                                           super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pvVar6);
            }
            return;
          }
LAB_0011075c:
          fatal(pcVar22);
        }
        pcVar22 = "Image height (%u pixels) is not a multiple of 8!";
      }
      fatal(pcVar22);
    }
    png_destroy_read_struct(local_100,0,0);
    pcVar22 = "Failed to allocate PNG info structure: %s";
  }
  piVar17 = __errno_location();
  pcVar18 = strerror(*piVar17);
  fatal(pcVar22,pcVar18);
}

Assistant:

explicit Png(std::filesystem::path const &filePath) : path(filePath), colors() {
		if (file.open(path, std::ios_base::in | std::ios_base::binary) == nullptr) {
			fatal("Failed to open input image (\"%s\"): %s", file.string(path).c_str(),
			      strerror(errno));
		}

		options.verbosePrint(Options::VERB_LOG_ACT, "Opened input file\n");

		std::array<unsigned char, 8> pngHeader;

		if (file->sgetn(reinterpret_cast<char *>(pngHeader.data()), pngHeader.size())
		        != static_cast<std::streamsize>(pngHeader.size()) // Not enough bytes?
		    || png_sig_cmp(pngHeader.data(), 0, pngHeader.size()) != 0) {
			fatal("Input file (\"%s\") is not a PNG image!", file.string(path).c_str());
		}

		options.verbosePrint(Options::VERB_INTERM, "PNG header signature is OK\n");

		png = png_create_read_struct(PNG_LIBPNG_VER_STRING, (png_voidp)this, handleError,
		                             handleWarning);
		if (!png) {
			fatal("Failed to allocate PNG structure: %s", strerror(errno));
		}

		info = png_create_info_struct(png);
		if (!info) {
			png_destroy_read_struct(&png, nullptr, nullptr);
			fatal("Failed to allocate PNG info structure: %s", strerror(errno));
		}

		png_set_read_fn(png, this, readData);
		png_set_sig_bytes(png, pngHeader.size());

		// TODO: png_set_crc_action(png, PNG_CRC_ERROR_QUIT, PNG_CRC_WARN_DISCARD);

		// Skipping chunks we don't use should improve performance
		// TODO: png_set_keep_unknown_chunks(png, ...);

		// Process all chunks up to but not including the image data
		png_read_info(png, info);

		int bitDepth, interlaceType; //, compressionType, filterMethod;

		png_get_IHDR(png, info, &width, &height, &bitDepth, &colorType, &interlaceType, nullptr,
		             nullptr);

		if (options.inputSlice.width == 0 && width % 8 != 0) {
			fatal("Image width (%" PRIu32 " pixels) is not a multiple of 8!", width);
		}
		if (options.inputSlice.height == 0 && height % 8 != 0) {
			fatal("Image height (%" PRIu32 " pixels) is not a multiple of 8!", height);
		}

		pixels.resize(static_cast<size_t>(width) * static_cast<size_t>(height));

		auto colorTypeName = [this]() {
			switch (colorType) {
			case PNG_COLOR_TYPE_GRAY:
				return "grayscale";
			case PNG_COLOR_TYPE_GRAY_ALPHA:
				return "grayscale + alpha";
			case PNG_COLOR_TYPE_PALETTE:
				return "palette";
			case PNG_COLOR_TYPE_RGB:
				return "RGB";
			case PNG_COLOR_TYPE_RGB_ALPHA:
				return "RGB + alpha";
			default:
				fatal("Unknown color type %d", colorType);
			}
		};
		auto interlaceTypeName = [&interlaceType]() {
			switch (interlaceType) {
			case PNG_INTERLACE_NONE:
				return "not interlaced";
			case PNG_INTERLACE_ADAM7:
				return "interlaced (Adam7)";
			default:
				fatal("Unknown interlace type %d", interlaceType);
			}
		};
		options.verbosePrint(Options::VERB_INTERM,
		                     "Input image: %" PRIu32 "x%" PRIu32 " pixels, %dbpp %s, %s\n", width,
		                     height, bitDepth, colorTypeName(), interlaceTypeName());

		if (png_get_PLTE(png, info, &embeddedPal, &nbColors) != 0) {
			int nbTransparentEntries;
			if (png_get_tRNS(png, info, &transparencyPal, &nbTransparentEntries, nullptr)) {
				assert(nbTransparentEntries == nbColors);
			}

			options.verbosePrint(Options::VERB_INTERM, "Embedded palette has %d colors: [",
			                     nbColors);
			for (int i = 0; i < nbColors; ++i) {
				auto const &color = embeddedPal[i];
				options.verbosePrint(
				    Options::VERB_INTERM, "#%02x%02x%02x%02x%s", color.red, color.green, color.blue,
				    transparencyPal ? transparencyPal[i] : 0xFF, i != nbColors - 1 ? ", " : "]\n");
			}
		} else {
			options.verbosePrint(Options::VERB_INTERM, "No embedded palette\n");
		}

		// Set up transformations; to turn everything into RGBA888
		// TODO: it's not necessary to uniformize the pixel data (in theory), and not doing
		// so *might* improve performance, and should reduce memory usage.

		// Convert grayscale to RGB
		switch (colorType & ~PNG_COLOR_MASK_ALPHA) {
		case PNG_COLOR_TYPE_GRAY:
			png_set_gray_to_rgb(png); // This also converts tRNS to alpha
			break;
		case PNG_COLOR_TYPE_PALETTE:
			png_set_palette_to_rgb(png);
			break;
		}

		if (png_get_valid(png, info, PNG_INFO_tRNS)) {
			// If we read a tRNS chunk, convert it to alpha
			png_set_tRNS_to_alpha(png);
		} else if (!(colorType & PNG_COLOR_MASK_ALPHA)) {
			// Otherwise, if we lack an alpha channel, default to full opacity
			png_set_add_alpha(png, 0xFFFF, PNG_FILLER_AFTER);
		}

		// Scale 16bpp back to 8 (we don't need all of that precision anyway)
		if (bitDepth == 16) {
			png_set_scale_16(png);
		} else if (bitDepth < 8) {
			png_set_packing(png);
		}

		// Do NOT call `png_set_interlace_handling`. We want to expand the rows ourselves.

		// Update `info` with the transformations
		png_read_update_info(png, info);
		// These shouldn't have changed
		assert(png_get_image_width(png, info) == width);
		assert(png_get_image_height(png, info) == height);
		// These should have changed, however
		assert(png_get_color_type(png, info) == PNG_COLOR_TYPE_RGBA);
		assert(png_get_bit_depth(png, info) == 8);

		// Now that metadata has been read, we can process the image data

		size_t nbRowBytes = png_get_rowbytes(png, info);
		assert(nbRowBytes != 0);
		DefaultInitVec<png_byte> row(nbRowBytes);
		// Holds known-conflicting color pairs to avoid warning about them twice.
		// We don't need to worry about transitivity, as ImagePalette slots are immutable once
		// assigned, and conflicts always occur between that and another color.
		// For the same reason, we don't need to worry about order, either.
		std::vector<std::tuple<uint32_t, uint32_t>> conflicts;
		// Holds colors whose alpha value is ambiguous
		std::vector<uint32_t> indeterminates;

		// Assign a color to the given position, and register it in the image palette as well
		auto assignColor = [this, &conflicts, &indeterminates](png_uint_32 x, png_uint_32 y,
		                                                       Rgba &&color) {
			if (!color.isTransparent() && !color.isOpaque()) {
				uint32_t css = color.toCSS();
				if (std::find(indeterminates.begin(), indeterminates.end(), css)
				    == indeterminates.end()) {
					error("Color #%08x is neither transparent (alpha < %u) nor opaque (alpha >= "
					      "%u) [first seen at x: %" PRIu32 ", y: %" PRIu32 "]",
					      css, Rgba::transparency_threshold, Rgba::opacity_threshold, x, y);
					indeterminates.push_back(css);
				}
			} else if (Rgba const *other = colors.registerColor(color); other) {
				std::tuple conflicting{color.toCSS(), other->toCSS()};
				// Do not report combinations twice
				if (std::find(conflicts.begin(), conflicts.end(), conflicting) == conflicts.end()) {
					warning("Fusing colors #%08x and #%08x into Game Boy color $%04x [first seen "
					        "at x: %" PRIu32 ", y: %" PRIu32 "]",
					        std::get<0>(conflicting), std::get<1>(conflicting), color.cgbColor(), x,
					        y);
					// Do not report this combination again
					conflicts.emplace_back(conflicting);
				}
			}

			pixel(x, y) = color;
		};

		if (interlaceType == PNG_INTERLACE_NONE) {
			for (png_uint_32 y = 0; y < height; ++y) {
				png_read_row(png, row.data(), nullptr);

				for (png_uint_32 x = 0; x < width; ++x) {
					assignColor(x, y,
					            Rgba(row[x * 4], row[x * 4 + 1], row[x * 4 + 2], row[x * 4 + 3]));
				}
			}
		} else {
			assert(interlaceType == PNG_INTERLACE_ADAM7);

			// For interlace to work properly, we must read the image `nbPasses` times
			for (int pass = 0; pass < PNG_INTERLACE_ADAM7_PASSES; ++pass) {
				// The interlacing pass must be skipped if its width or height is reported as zero
				if (PNG_PASS_COLS(width, pass) == 0 || PNG_PASS_ROWS(height, pass) == 0) {
					continue;
				}

				png_uint_32 xStep = 1u << PNG_PASS_COL_SHIFT(pass);
				png_uint_32 yStep = 1u << PNG_PASS_ROW_SHIFT(pass);

				for (png_uint_32 y = PNG_PASS_START_ROW(pass); y < height; y += yStep) {
					png_bytep ptr = row.data();
					png_read_row(png, ptr, nullptr);

					for (png_uint_32 x = PNG_PASS_START_COL(pass); x < width; x += xStep) {
						assignColor(x, y, Rgba(ptr[0], ptr[1], ptr[2], ptr[3]));
						ptr += 4;
					}
				}
			}
		}

		// We don't care about chunks after the image data (comments, etc.)
		png_read_end(png, nullptr);
	}